

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

int Helmet_off(void)

{
  if (uarmh == (obj *)0x0) {
    return 0;
  }
  Oprops_off(uarmh,4);
  takeoff_mask = takeoff_mask & 0xfffffffb;
  switch(uarmh->otyp) {
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4e:
  case 0x4f:
  case 0x50:
    goto switchD_00183e76_caseD_48;
  case 0x4c:
    if (cancelled_don != '\0') goto switchD_00183e76_caseD_48;
    u.abon.a[5] = u.abon.a[5] + (-(urole.malenum == 0x168) | 1U);
    break;
  case 0x4d:
    break;
  case 0x51:
    if (cancelled_don == '\0') {
      adj_abon(uarmh,-uarmh->spe);
    }
    goto switchD_00183e76_caseD_48;
  case 0x52:
    u.ualign.type = u.ualignbase[0];
    u.ublessed = 0;
    break;
  case 0x53:
    setworn((obj *)0x0,4);
    see_monsters();
    return 0;
  default:
    warning("Unknown type of %s (%d)","helmet",(ulong)(uint)(int)uarmh->otyp);
    goto switchD_00183e76_caseD_48;
  }
  iflags.botl = '\x01';
switchD_00183e76_caseD_48:
  setworn((obj *)0x0,4);
  cancelled_don = '\0';
  return 0;
}

Assistant:

int Helmet_off(void)
{
    if (!uarmh) return 0;

    Oprops_off(uarmh, WORN_HELMET);

    takeoff_mask &= ~W_ARMH;

    switch(uarmh->otyp) {
	case FEDORA:
	case HELMET:
	case DENTED_POT:
	case ELVEN_LEATHER_HELM:
	case DWARVISH_IRON_HELM:
	case ORCISH_HELM:
	case TINFOIL_HAT:
	    break;
	case DUNCE_CAP:
	    iflags.botl = 1;
	    break;
	case CORNUTHAUM:
	    if (!cancelled_don) {
		ABON(A_CHA) += (Role_if (PM_WIZARD) ? -1 : 1);
		iflags.botl = 1;
	    }
	    break;
	case HELM_OF_TELEPATHY:
	    /* need to update ability before calling see_monsters() */
	    setworn(NULL, W_ARMH);
	    see_monsters();
	    return 0;
	case HELM_OF_BRILLIANCE:
	    if (!cancelled_don) adj_abon(uarmh, -uarmh->spe);
	    break;
	case HELM_OF_OPPOSITE_ALIGNMENT:
	    u.ualign.type = u.ualignbase[A_CURRENT];
	    u.ublessed = 0; /* lose the other god's protection */
	    iflags.botl = 1;
	    break;
	default: warning(unknown_type, c_helmet, uarmh->otyp);
    }
    setworn(NULL, W_ARMH);
    cancelled_don = FALSE;
    return 0;
}